

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O3

void __thiscall
google::protobuf::FieldDescriptor::DebugString(FieldDescriptor *this,int depth,string *contents)

{
  FieldDescriptor FVar1;
  uint uVar2;
  char *__s;
  bool bVar3;
  size_t sVar4;
  FieldDescriptor *pFVar5;
  string formatted_options;
  string field_type;
  string prefix;
  string local_200;
  SubstituteArg local_1e0;
  SubstituteArg local_1b0;
  SubstituteArg local_180;
  SubstituteArg local_150;
  SubstituteArg local_120;
  SubstituteArg local_f0;
  SubstituteArg local_c0;
  SubstituteArg local_90;
  SubstituteArg local_60;
  
  prefix._M_dataplus._M_p = (pointer)&prefix.field_2;
  std::__cxx11::string::_M_construct((ulong)&prefix,(char)depth * '\x02');
  field_type._M_dataplus._M_p = (pointer)&field_type.field_2;
  field_type._M_string_length = 0;
  field_type.field_2._M_local_buf[0] = '\0';
  uVar2 = *(uint *)(this + 0x2c);
  if ((ulong)uVar2 == 0xb) {
    std::operator+(&formatted_options,".",
                   *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                    (*(long *)(this + 0x48) + 8));
LAB_001cf21f:
    std::__cxx11::string::operator=((string *)&field_type,(string *)&formatted_options);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)formatted_options._M_dataplus._M_p != &formatted_options.field_2) {
      operator_delete(formatted_options._M_dataplus._M_p,
                      CONCAT71(formatted_options.field_2._M_allocated_capacity._1_7_,
                               formatted_options.field_2._M_local_buf[0]) + 1);
    }
  }
  else {
    if (uVar2 == 0xe) {
      std::operator+(&formatted_options,".",
                     *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                      (*(long *)(this + 0x50) + 8));
      goto LAB_001cf21f;
    }
    __s = *(char **)(kTypeToName + (ulong)uVar2 * 8);
    strlen(__s);
    std::__cxx11::string::_M_replace((ulong)&field_type,0,(char *)0x0,(ulong)__s);
  }
  formatted_options._M_dataplus = prefix._M_dataplus;
  formatted_options._M_string_length =
       CONCAT44(formatted_options._M_string_length._4_4_,(undefined4)prefix._M_string_length);
  local_120.text_ = *(char **)(kLabelToName + (ulong)*(uint *)(this + 0x30) * 8);
  sVar4 = strlen(local_120.text_);
  local_120.size_ = (int)sVar4;
  local_150.text_ = field_type._M_dataplus._M_p;
  local_150.size_ = (int)field_type._M_string_length;
  pFVar5 = this;
  if (*(int *)(this + 0x2c) == 10) {
    pFVar5 = *(FieldDescriptor **)(this + 0x48);
  }
  local_180.text_ = (char *)**(undefined8 **)pFVar5;
  local_180.size_ = *(int *)(*(undefined8 **)pFVar5 + 1);
  local_1e0.text_ = FastInt32ToBuffer(*(int32 *)(this + 0x28),local_1e0.scratch_);
  sVar4 = strlen(local_1e0.text_);
  local_1e0.size_ = (int)sVar4;
  local_1b0.text_ = (char *)0x0;
  local_1b0.size_ = -1;
  local_60.text_ = (char *)0x0;
  local_60.size_ = -1;
  local_90.text_ = (char *)0x0;
  local_90.size_ = -1;
  local_c0.text_ = (char *)0x0;
  local_c0.size_ = -1;
  local_f0.text_ = (char *)0x0;
  local_f0.size_ = -1;
  strings::SubstituteAndAppend
            (contents,"$0$1 $2 $3 = $4",(SubstituteArg *)&formatted_options,&local_120,&local_150,
             &local_180,&local_1e0,&local_1b0,&local_60,&local_90,&local_c0,&local_f0);
  FVar1 = this[0x68];
  if (FVar1 == (FieldDescriptor)0x1) {
    DefaultValueAsString_abi_cxx11_(&local_200,this,true);
    formatted_options._M_dataplus._M_p = local_200._M_dataplus._M_p;
    formatted_options._M_string_length =
         CONCAT44(formatted_options._M_string_length._4_4_,(undefined4)local_200._M_string_length);
    local_120.text_ = (char *)0x0;
    local_120.size_ = -1;
    local_150.text_ = (pointer)0x0;
    local_150.size_ = -1;
    local_180.text_ = (char *)0x0;
    local_180.size_ = -1;
    local_1e0.text_ = (char *)0x0;
    local_1e0.size_ = -1;
    local_1b0.text_ = (char *)0x0;
    local_1b0.size_ = -1;
    local_60.text_ = (char *)0x0;
    local_60.size_ = -1;
    local_90.text_ = (char *)0x0;
    local_90.size_ = -1;
    local_c0.text_ = (char *)0x0;
    local_c0.size_ = -1;
    local_f0.text_ = (char *)0x0;
    local_f0.size_ = -1;
    strings::SubstituteAndAppend
              (contents," [default = $0",(SubstituteArg *)&formatted_options,&local_120,&local_150,
               &local_180,&local_1e0,&local_1b0,&local_60,&local_90,&local_c0,&local_f0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_200._M_dataplus._M_p != &local_200.field_2) {
      operator_delete(local_200._M_dataplus._M_p,local_200.field_2._M_allocated_capacity + 1);
    }
  }
  formatted_options._M_string_length = 0;
  formatted_options.field_2._M_local_buf[0] = '\0';
  formatted_options._M_dataplus._M_p = (pointer)&formatted_options.field_2;
  bVar3 = anon_unknown_1::FormatBracketedOptions
                    (depth,*(Message **)(this + 0x60),&formatted_options);
  if (bVar3) {
    std::__cxx11::string::append((char *)contents);
    std::__cxx11::string::_M_append((char *)contents,(ulong)formatted_options._M_dataplus._M_p);
  }
  else if (FVar1 == (FieldDescriptor)0x0) goto LAB_001cf52f;
  std::__cxx11::string::append((char *)contents);
LAB_001cf52f:
  if (*(int *)(this + 0x2c) == 10) {
    Descriptor::DebugString(*(Descriptor **)(this + 0x48),depth,contents);
  }
  else {
    std::__cxx11::string::append((char *)contents);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)formatted_options._M_dataplus._M_p != &formatted_options.field_2) {
    operator_delete(formatted_options._M_dataplus._M_p,
                    CONCAT71(formatted_options.field_2._M_allocated_capacity._1_7_,
                             formatted_options.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)field_type._M_dataplus._M_p != &field_type.field_2) {
    operator_delete(field_type._M_dataplus._M_p,
                    CONCAT71(field_type.field_2._M_allocated_capacity._1_7_,
                             field_type.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)prefix._M_dataplus._M_p != &prefix.field_2) {
    operator_delete(prefix._M_dataplus._M_p,prefix.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void FieldDescriptor::DebugString(int depth, string *contents) const {
  string prefix(depth * 2, ' ');
  string field_type;
  switch (type()) {
    case TYPE_MESSAGE:
      field_type = "." + message_type()->full_name();
      break;
    case TYPE_ENUM:
      field_type = "." + enum_type()->full_name();
      break;
    default:
      field_type = kTypeToName[type()];
  }

  strings::SubstituteAndAppend(contents, "$0$1 $2 $3 = $4",
                               prefix,
                               kLabelToName[label()],
                               field_type,
                               type() == TYPE_GROUP ? message_type()->name() :
                                                      name(),
                               number());

  bool bracketed = false;
  if (has_default_value()) {
    bracketed = true;
    strings::SubstituteAndAppend(contents, " [default = $0",
                                 DefaultValueAsString(true));
  }

  string formatted_options;
  if (FormatBracketedOptions(depth, options(), &formatted_options)) {
    contents->append(bracketed ? ", " : " [");
    bracketed = true;
    contents->append(formatted_options);
  }

  if (bracketed) {
    contents->append("]");
  }

  if (type() == TYPE_GROUP) {
    message_type()->DebugString(depth, contents);
  } else {
    contents->append(";\n");
  }
}